

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinVerticesProcess.cpp
# Opt level: O2

bool anon_unknown.dwarf_305fda::areVerticesEqual(Vertex *lhs,Vertex *rhs,bool complex)

{
  bool bVar1;
  aiColor4D *pColor2;
  aiVector3t<float> *v2;
  int i;
  long lVar2;
  aiColor4D *pColor1;
  aiVector3t<float> *v1;
  ai_real aVar3;
  aiVector3t<float> aVar4;
  
  aVar4 = operator-(&lhs->position,&rhs->position);
  if ((aVar4.z * aVar4.z + aVar4.x * aVar4.x + aVar4.y * aVar4.y <= 9.9999994e-11) &&
     (aVar4 = operator-(&lhs->normal,&rhs->normal),
     aVar4.z * aVar4.z + aVar4.x * aVar4.x + aVar4.y * aVar4.y <= 9.9999994e-11)) {
    v1 = lhs->texcoords;
    v2 = rhs->texcoords;
    aVar4 = operator-(v1,v2);
    if ((aVar4.z * aVar4.z + aVar4.x * aVar4.x + aVar4.y * aVar4.y <= 9.9999994e-11) &&
       (aVar4 = operator-(&lhs->tangent,&rhs->tangent),
       aVar4.z * aVar4.z + aVar4.x * aVar4.x + aVar4.y * aVar4.y <= 9.9999994e-11)) {
      aVar4 = operator-(&lhs->bitangent,&rhs->bitangent);
      bVar1 = aVar4.z * aVar4.z + aVar4.x * aVar4.x + aVar4.y * aVar4.y <= 9.9999994e-11;
      if (!complex || !bVar1) {
        return bVar1;
      }
      pColor1 = lhs->colors;
      pColor2 = rhs->colors;
      lVar2 = 0;
      do {
        if (lVar2 != 0) {
          if (lVar2 == 8) {
            return true;
          }
          aVar4 = operator-(v1,v2);
          if (9.9999994e-11 < aVar4.z * aVar4.z + aVar4.x * aVar4.x + aVar4.y * aVar4.y) {
            return false;
          }
        }
        aVar3 = Assimp::GetColorDifference(pColor1,pColor2);
        lVar2 = lVar2 + 1;
        pColor2 = pColor2 + 1;
        pColor1 = pColor1 + 1;
        v2 = v2 + 1;
        v1 = v1 + 1;
        if (9.9999994e-11 < aVar3) {
          return false;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool areVerticesEqual(const Vertex &lhs, const Vertex &rhs, bool complex)
{
    // A little helper to find locally close vertices faster.
    // Try to reuse the lookup table from the last step.
    const static float epsilon = 1e-5f;
    // Squared because we check against squared length of the vector difference
    static const float squareEpsilon = epsilon * epsilon;

    // Square compare is useful for animeshes vertices compare
    if ((lhs.position - rhs.position).SquareLength() > squareEpsilon) {
        return false;
    }

    // We just test the other attributes even if they're not present in the mesh.
    // In this case they're initialized to 0 so the comparison succeeds.
    // By this method the non-present attributes are effectively ignored in the comparison.
    if ((lhs.normal - rhs.normal).SquareLength() > squareEpsilon) {
        return false;
    }

    if ((lhs.texcoords[0] - rhs.texcoords[0]).SquareLength() > squareEpsilon) {
        return false;
    }

    if ((lhs.tangent - rhs.tangent).SquareLength() > squareEpsilon) {
        return false;
    }

    if ((lhs.bitangent - rhs.bitangent).SquareLength() > squareEpsilon) {
        return false;
    }

    // Usually we won't have vertex colors or multiple UVs, so we can skip from here
    // Actually this increases runtime performance slightly, at least if branch
    // prediction is on our side.
    if (complex) {
        for (int i = 0; i < 8; i++) {
            if (i > 0 && (lhs.texcoords[i] - rhs.texcoords[i]).SquareLength() > squareEpsilon) {
                return false;
            }
            if (GetColorDifference(lhs.colors[i], rhs.colors[i]) > squareEpsilon) {
                return false;
            }
        }
    }
    return true;
}